

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::getRuleSetDisplayName
          (UnicodeString *__return_storage_ptr__,RuleBasedNumberFormat *this,
          UnicodeString *ruleSetName,Locale *localeParam)

{
  LocalizationInfo *pLVar1;
  uint uVar2;
  char16_t *pcVar3;
  UnicodeString rsn;
  UnicodeString UStack_68;
  
  if (this->localizations == (LocalizationInfo *)0x0) {
    (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_003b5258;
    (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
    UnicodeString::setToBogus(__return_storage_ptr__);
  }
  else {
    UnicodeString::UnicodeString(&UStack_68,ruleSetName);
    pLVar1 = this->localizations;
    pcVar3 = UnicodeString::getTerminatedBuffer(&UStack_68);
    uVar2 = (*pLVar1->_vptr_LocalizationInfo[9])(pLVar1,pcVar3);
    (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x2a])
              (__return_storage_ptr__,this,(ulong)uVar2,localeParam);
    UnicodeString::~UnicodeString(&UStack_68);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString 
RuleBasedNumberFormat::getRuleSetDisplayName(const UnicodeString& ruleSetName, const Locale& localeParam) {
    if (localizations) {
        UnicodeString rsn(ruleSetName);
        int32_t ix = localizations->indexForRuleSet(rsn.getTerminatedBuffer());
        return getRuleSetDisplayName(ix, localeParam);
    }
    UnicodeString bogus;
    bogus.setToBogus();
    return bogus;
}